

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

void __thiscall
btRaycastVehicle::updateWheelTransformsWS
          (btRaycastVehicle *this,btWheelInfo *wheel,bool interpolatedTransform)

{
  btRigidBody *pbVar1;
  btMotionState *pbVar2;
  undefined3 in_register_00000011;
  btVector3 bVar3;
  btTransform chassisTrans;
  btTransform local_58;
  
  (wheel->m_raycastInfo).m_isInContact = false;
  pbVar1 = this->m_chassisBody;
  local_58.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
  local_58.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)
        ((pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
  local_58.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
  local_58.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)
        ((pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
  local_58.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
  local_58.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)
        ((pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
  local_58.m_origin.m_floats[0] =
       (pbVar1->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
  local_58.m_origin.m_floats[1] =
       (pbVar1->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
  local_58.m_origin.m_floats[2] =
       (pbVar1->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  local_58.m_origin.m_floats[3] =
       (pbVar1->super_btCollisionObject).m_worldTransform.m_origin.m_floats[3];
  if ((CONCAT31(in_register_00000011,interpolatedTransform) != 0) &&
     (pbVar2 = pbVar1->m_optionalMotionState, pbVar2 != (btMotionState *)0x0)) {
    (*pbVar2->_vptr_btMotionState[2])(pbVar2,&local_58);
  }
  bVar3 = btTransform::operator()(&local_58,&wheel->m_chassisConnectionPointCS);
  *&(wheel->m_raycastInfo).m_hardPointWS.m_floats = bVar3.m_floats;
  bVar3 = operator*(&local_58.m_basis,&wheel->m_wheelDirectionCS);
  *&(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats = bVar3.m_floats;
  bVar3 = operator*(&local_58.m_basis,&wheel->m_wheelAxleCS);
  *&(wheel->m_raycastInfo).m_wheelAxleWS.m_floats = bVar3.m_floats;
  return;
}

Assistant:

void	btRaycastVehicle::updateWheelTransformsWS(btWheelInfo& wheel , bool interpolatedTransform)
{
	wheel.m_raycastInfo.m_isInContact = false;

	btTransform chassisTrans = getChassisWorldTransform();
	if (interpolatedTransform && (getRigidBody()->getMotionState()))
	{
		getRigidBody()->getMotionState()->getWorldTransform(chassisTrans);
	}

	wheel.m_raycastInfo.m_hardPointWS = chassisTrans( wheel.m_chassisConnectionPointCS );
	wheel.m_raycastInfo.m_wheelDirectionWS = chassisTrans.getBasis() *  wheel.m_wheelDirectionCS ;
	wheel.m_raycastInfo.m_wheelAxleWS = chassisTrans.getBasis() * wheel.m_wheelAxleCS;
}